

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDistribution.cpp
# Opt level: O1

void __thiscall
chrono::ChDiscreteDistribution::ChDiscreteDistribution
          (ChDiscreteDistribution *this,ChVectorDynamic<> *mx,ChVectorDynamic<> *my)

{
  double *pdVar1;
  ChVectorDynamic<> *this_00;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Index size;
  ChException *this_01;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  string local_50;
  
  (this->super_ChDistribution)._vptr_ChDistribution =
       (_func_int **)&PTR__ChDiscreteDistribution_00b2af20;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->x,(DenseStorage<double,__1,__1,_1,_0> *)mx
            );
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->y,(DenseStorage<double,__1,__1,_1,_0> *)my
            );
  this_00 = &this->cdf_y;
  (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  uVar12 = (my->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((mx->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar12) {
    this_01 = (ChException *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Probability values and percentages must have the same size","");
    ChException::ChException(this_01,&local_50);
    __cxa_throw(this_01,&ChException::typeinfo,ChException::~ChException);
  }
  pdVar3 = (my->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if ((this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar12) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar12,1);
  }
  uVar4 = (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar4 != uVar12) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                 );
  }
  pdVar5 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  uVar12 = uVar4 + 7;
  if (-1 < (long)uVar4) {
    uVar12 = uVar4;
  }
  uVar12 = uVar12 & 0xfffffffffffffff8;
  if (7 < (long)uVar4) {
    lVar13 = 0;
    do {
      pdVar2 = pdVar3 + lVar13;
      dVar16 = pdVar2[1];
      dVar6 = pdVar2[2];
      dVar7 = pdVar2[3];
      dVar8 = pdVar2[4];
      dVar9 = pdVar2[5];
      dVar10 = pdVar2[6];
      dVar11 = pdVar2[7];
      pdVar1 = pdVar5 + lVar13;
      *pdVar1 = *pdVar2;
      pdVar1[1] = dVar16;
      pdVar1[2] = dVar6;
      pdVar1[3] = dVar7;
      pdVar1[4] = dVar8;
      pdVar1[5] = dVar9;
      pdVar1[6] = dVar10;
      pdVar1[7] = dVar11;
      lVar13 = lVar13 + 8;
    } while (lVar13 < (long)uVar12);
  }
  if ((long)uVar12 < (long)uVar4) {
    do {
      pdVar5[uVar12] = pdVar3[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar4 != uVar12);
  }
  uVar12 = (this->x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  if (0 < (long)uVar12) {
    pdVar3 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar4 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    uVar14 = (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    pdVar5 = (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    dVar16 = 0.0;
    uVar15 = 0;
    do {
      if (((~((long)uVar4 >> 0x3f) & uVar4) == uVar15) ||
         ((~((long)uVar14 >> 0x3f) & uVar14) == uVar15)) goto LAB_004fcec1;
      dVar16 = dVar16 + pdVar3[uVar15];
      pdVar5[uVar15] = dVar16;
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
  }
  if ((0 < (long)uVar12) &&
     (uVar4 = (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows, (long)uVar12 <= (long)uVar4)) {
    pdVar3 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    dVar16 = pdVar3[uVar12 - 1];
    if ((dVar16 != 1.0) || (NAN(dVar16))) {
      uVar14 = 0;
      do {
        if (uVar4 == uVar14) goto LAB_004fcec1;
        pdVar3[uVar14] = (1.0 / dVar16) * pdVar3[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
    pdVar3[uVar12 - 1] = 1.0;
    return;
  }
LAB_004fcec1:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

ChDiscreteDistribution::ChDiscreteDistribution(ChVectorDynamic<>& mx, ChVectorDynamic<>& my) : x(mx), y(my) {
    if (mx.size() != my.size())
        throw ChException("Probability values and percentages must have the same size");

    cdf_y = my;

    // compute CDF
    double integral = 0;
    for (int i = 0; i < x.size(); i++) {
        integral += y(i);
        cdf_y(i) = integral;
    }
    // normalize if P(x) had not unit integral
    double totintegral = cdf_y(x.size() - 1);
    if (totintegral != 1.0) {
        for (int i = 0; i < x.size(); i++) {
            cdf_y(i) *= 1. / totintegral;
        }
    }
    cdf_y(x.size() - 1) = 1.0;
}